

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

idx_t duckdb::Interpolator<true>::Index(QuantileValue *q,idx_t n)

{
  unsigned_long uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  hugeint_t hVar4;
  hugeint_t hVar5;
  hugeint_t scaling;
  hugeint_t scaled_n;
  hugeint_t scaled_q;
  hugeint_t local_68;
  hugeint_t local_50;
  hugeint_t local_40;
  hugeint_t local_30;
  
  if ((q->val).type_.id_ == DECIMAL) {
    hVar5 = q->integral;
    local_68.lower = (q->scaling).lower;
    local_68.upper = (q->scaling).upper;
    hVar4 = Hugeint::Convert<unsigned_long>(n);
    local_30 = DecimalMultiplyOverflowCheck::
               Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(hVar4,hVar5);
    hVar4 = Hugeint::Convert<unsigned_long>(n);
    hVar5.upper = local_68.upper;
    hVar5.lower = local_68.lower;
    local_40 = DecimalMultiplyOverflowCheck::
               Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(hVar4,hVar5);
    local_50 = hugeint_t::operator-(&local_40,&local_30);
    hVar5 = hugeint_t::operator/(&local_50,&local_68);
    uVar1 = Cast::Operation<duckdb::hugeint_t,unsigned_long>(hVar5);
  }
  else {
    auVar3._8_4_ = (int)(n >> 0x20);
    auVar3._0_8_ = n;
    auVar3._12_4_ = 0x45300000;
    dVar2 = (auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0);
    dVar2 = floor(dVar2 - q->dbl * dVar2);
    uVar1 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
  }
  return (n - uVar1) + -1 + (ulong)(n - uVar1 == 0);
}

Assistant:

static inline idx_t Index(const QuantileValue &q, const idx_t n) {
		idx_t floored;
		switch (q.val.type().id()) {
		case LogicalTypeId::DECIMAL: {
			//	Integer arithmetic for accuracy
			const auto integral = q.integral;
			const auto scaling = q.scaling;
			const auto scaled_q =
			    DecimalMultiplyOverflowCheck::Operation<hugeint_t, hugeint_t, hugeint_t>(Hugeint::Convert(n), integral);
			const auto scaled_n =
			    DecimalMultiplyOverflowCheck::Operation<hugeint_t, hugeint_t, hugeint_t>(Hugeint::Convert(n), scaling);
			floored = Cast::Operation<hugeint_t, idx_t>((scaled_n - scaled_q) / scaling);
			break;
		}
		default:
			const auto scaled_q = double(n) * q.dbl;
			floored = LossyNumericCast<idx_t>(floor(double(n) - scaled_q));
			break;
		}

		return MaxValue<idx_t>(1, n - floored) - 1;
	}